

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardize_data_array.h
# Opt level: O0

vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
* polyscope::
  adaptorF_convertArrayOfVectorToStdVectorImpl<glm::vec<3,float,(glm::qualifier)0>,3u,std::vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>>,void>
            (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *param_1,
            vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *param_2)

{
  size_t sVar1;
  const_reference this;
  reference this_00;
  float *pfVar2;
  float fVar3;
  double dVar4;
  size_t j;
  size_t i;
  size_t dataSize;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *dataOut;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  allocator_type *in_stack_ffffffffffffff90;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *this_01;
  undefined8 local_48;
  undefined8 local_40;
  
  this_01 = param_1;
  sVar1 = adaptorF_size<std::vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>>>
                    ((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x223d3e);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(this_01,(size_type)param_1,in_stack_ffffffffffffff90);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::~allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x223d5e);
  for (local_40 = 0; local_40 < sVar1; local_40 = local_40 + 1) {
    for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
      this = std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::
             operator[](param_2,local_40);
      dVar4 = geometrycentral::Vector3::operator[](this,(int)local_48);
      fVar3 = (float)dVar4;
      this_00 = std::
                vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ::operator[](this_01,local_40);
      pfVar2 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](this_00,(int)local_48);
      *pfVar2 = fVar3;
    }
  }
  return param_1;
}

Assistant:

std::vector<O> adaptorF_convertArrayOfVectorToStdVectorImpl(PreferenceT<6>, const T& inputData) {
  size_t dataSize = adaptorF_size(inputData);
  std::vector<O> dataOut(dataSize);
  for (size_t i = 0; i < dataSize; i++) {
    for (size_t j = 0; j < D; j++) {
      dataOut[i][j] = inputData[i][j];
    }
  }
  return dataOut;
}